

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void createCrosshairMesh(void)

{
  u32 vbo;
  
  (*glad_debug_glGenVertexArrays)(1,&gpu::crosshairVao);
  (*glad_debug_glBindVertexArray)(gpu::crosshairVao);
  (*glad_debug_glGenBuffers)(1,&vbo);
  (*glad_debug_glBindBuffer)(0x8892,vbo);
  (*glad_debug_glBufferData)(0x8892,0x90,createCrosshairMesh::verts,0x88e4);
  (*glad_debug_glEnableVertexAttribArray)(0);
  (*glad_debug_glVertexAttribPointer)(0,3,0x1406,'\0',0x18,(void *)0x0);
  (*glad_debug_glEnableVertexAttribArray)(1);
  (*glad_debug_glVertexAttribPointer)(1,3,0x1406,'\0',0x18,(void *)0xc);
  return;
}

Assistant:

void createCrosshairMesh()
{
    glGenVertexArrays(1, &gpu::crosshairVao);
    glBindVertexArray(gpu::crosshairVao);
    u32 vbo;
    glGenBuffers(1, &vbo);
    glBindBuffer(GL_ARRAY_BUFFER, vbo);
    static const float verts[] = {
        -1, 0, 0,  1, 0, 0,
        +1, 0, 0,  1, 0, 0,
        0, -1, 0,  0, 1, 0,
        0, +1, 0,  0, 1, 0,
        0, 0, -1,  0, 0, 1,
        0, 0, +1,  0, 0, 1
    };
    constexpr int stride = 6 * sizeof(float);
    glBufferData(GL_ARRAY_BUFFER, sizeof(verts), verts, GL_STATIC_DRAW);
    glEnableVertexAttribArray(0);
    glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, stride, nullptr);
    glEnableVertexAttribArray(1);
    glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, stride, (void*)(3*sizeof(float)));
}